

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chimp_scan.hpp
# Opt level: O0

void __thiscall
duckdb::ChimpScanState<double>::ChimpScanState(ChimpScanState<double> *this,ColumnSegment *segment)

{
  uint uVar1;
  _func_int **pp_Var2;
  data_ptr_t pdVar3;
  idx_t iVar4;
  ColumnSegment *in_RSI;
  SegmentScanState *in_RDI;
  uint metadata_offset;
  data_ptr_t start_of_data_segment;
  data_ptr_t dataptr;
  BufferManager *buffer_manager;
  BufferHandle *in_stack_ffffffffffffff58;
  ChimpGroupState<unsigned_long> *in_stack_ffffffffffffff60;
  data_ptr_t pdVar5;
  __atomic_base<unsigned_long> *in_stack_ffffffffffffff68;
  BufferHandle *in_stack_ffffffffffffff70;
  undefined1 local_40 [24];
  BufferManager *local_28;
  ColumnSegment *local_10;
  
  local_10 = in_RSI;
  SegmentScanState::SegmentScanState(in_RDI);
  in_RDI->_vptr_SegmentScanState = (_func_int **)&PTR__ChimpScanState_0350ece0;
  BufferHandle::BufferHandle(in_stack_ffffffffffffff70);
  in_RDI[5]._vptr_SegmentScanState = (_func_int **)0x0;
  ChimpGroupState<unsigned_long>::ChimpGroupState((ChimpGroupState<unsigned_long> *)0x9ec482);
  in_RDI[0x4712]._vptr_SegmentScanState = (_func_int **)local_10;
  pp_Var2 = (_func_int **)
            ::std::__atomic_base::operator_cast_to_unsigned_long(in_stack_ffffffffffffff68);
  in_RDI[0x4713]._vptr_SegmentScanState = pp_Var2;
  local_28 = BufferManager::GetBufferManager((DatabaseInstance *)0x9ec4c9);
  (*local_28->_vptr_BufferManager[7])(local_40,local_28,&local_10->block);
  BufferHandle::operator=((BufferHandle *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  BufferHandle::~BufferHandle((BufferHandle *)in_stack_ffffffffffffff60);
  pdVar3 = BufferHandle::Ptr((BufferHandle *)0x9ec535);
  ColumnSegment::GetBlockOffset(local_10);
  ChimpGroupState<unsigned_long>::Init
            (in_stack_ffffffffffffff60,(uint8_t *)in_stack_ffffffffffffff58);
  pdVar5 = pdVar3;
  iVar4 = ColumnSegment::GetBlockOffset(local_10);
  uVar1 = Load<unsigned_int>(pdVar5 + iVar4);
  iVar4 = ColumnSegment::GetBlockOffset(local_10);
  in_RDI[4]._vptr_SegmentScanState = (_func_int **)(pdVar3 + uVar1 + iVar4);
  return;
}

Assistant:

explicit ChimpScanState(ColumnSegment &segment) : segment(segment), segment_count(segment.count) {
		auto &buffer_manager = BufferManager::GetBufferManager(segment.db);

		handle = buffer_manager.Pin(segment.block);
		auto dataptr = handle.Ptr();
		// ScanStates never exceed the boundaries of a Segment,
		// but are not guaranteed to start at the beginning of the Block
		auto start_of_data_segment = dataptr + segment.GetBlockOffset() + ChimpPrimitives::HEADER_SIZE;
		group_state.Init(start_of_data_segment);
		auto metadata_offset = Load<uint32_t>(dataptr + segment.GetBlockOffset());
		metadata_ptr = dataptr + segment.GetBlockOffset() + metadata_offset;
	}